

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

bool __thiscall Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsBool(X3DImporter *this,int pAttrIdx)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  element_type *peVar4;
  size_type sVar5;
  undefined4 extraout_var;
  DeadlyImportError *pDVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_99;
  undefined1 local_98 [8];
  string val;
  string local_70;
  undefined4 local_50;
  shared_ptr<const_Assimp::FIValue> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIBoolValue> boolValue;
  int pAttrIdx_local;
  X3DImporter *this_local;
  
  boolValue.super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = pAttrIdx;
  pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar3,
             (ulong)boolValue.
                    super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_);
  std::dynamic_pointer_cast<Assimp::FIBoolValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)local_30);
  std::shared_ptr<const_Assimp::FIValue>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    sVar5 = std::vector<bool,_std::allocator<bool>_>::size(&peVar4->value);
    if (sVar5 != 1) {
      val.field_2._M_local_buf[0xe] = '\x01';
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_70,"Invalid bool value",
                 (allocator *)(val.field_2._M_local_buf + 0xf));
      DeadlyImportError::DeadlyImportError(pDVar6,&local_70);
      val.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    this_local._7_1_ = std::vector<bool,_std::allocator<bool>_>::front(&peVar4->value);
    local_50 = 1;
  }
  else {
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)boolValue.
                                     super___shared_ptr<const_Assimp::FIBoolValue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_98,(char *)CONCAT44(extraout_var,iVar2),&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"false");
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"true");
      if (!bVar1) {
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_e0,"Bool attribute value can contain \"false\" or \"true\" not the \""
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_98);
        std::operator+(&local_c0,&local_e0,"\"");
        DeadlyImportError::DeadlyImportError(pDVar6,&local_c0);
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this_local._7_1_ = true;
    }
    local_50 = 1;
    std::__cxx11::string::~string((string *)local_98);
  }
  std::shared_ptr<const_Assimp::FIBoolValue>::~shared_ptr
            ((shared_ptr<const_Assimp::FIBoolValue> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool X3DImporter::XML_ReadNode_GetAttrVal_AsBool(const int pAttrIdx)
{
    auto boolValue = std::dynamic_pointer_cast<const FIBoolValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (boolValue) {
        if (boolValue->value.size() == 1) {
            return boolValue->value.front();
        }
        throw DeadlyImportError("Invalid bool value");
    }
    else {
        std::string val(mReader->getAttributeValue(pAttrIdx));

        if(val == "false")
            return false;
        else if(val == "true")
            return true;
        else
            throw DeadlyImportError("Bool attribute value can contain \"false\" or \"true\" not the \"" + val + "\"");
    }
}